

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O2

void Aig_MmStepStop(Aig_MmStep_t *p,int fVerbose)

{
  char **__ptr;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < p->nMems; lVar1 = lVar1 + 1) {
    Aig_MmFixedStop(p->pMems[lVar1],fVerbose);
  }
  if (p->nChunksAlloc != 0) {
    for (lVar1 = 0; __ptr = p->pChunks, lVar1 < p->nChunks; lVar1 = lVar1 + 1) {
      if (__ptr[lVar1] != (char *)0x0) {
        free(__ptr[lVar1]);
        p->pChunks[lVar1] = (char *)0x0;
      }
    }
    if (__ptr != (char **)0x0) {
      free(__ptr);
      p->pChunks = (char **)0x0;
    }
  }
  if (p->pMems != (Aig_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Aig_MmFixed_t **)0x0;
  }
  free(p->pMap);
  free(p);
  return;
}

Assistant:

void Aig_MmStepStop( Aig_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Aig_MmFixedStop( p->pMems[i], fVerbose );
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        ABC_FREE( p->pChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}